

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_fill_triangle(nk_command_buffer *b,float x0,float y0,float x1,float y1,float x2,float y2,
                     nk_color c)

{
  nk_rect *pnVar1;
  void *pvVar2;
  nk_rect *clip;
  nk_command_triangle_filled *cmd;
  float y2_local;
  float x2_local;
  float y1_local;
  float x1_local;
  float y0_local;
  float x0_local;
  nk_command_buffer *b_local;
  nk_color c_local;
  
  if (b != (nk_command_buffer *)0x0) {
    if (((((b != (nk_command_buffer *)0x0) && (b_local._7_1_ = c.a, b_local._7_1_ != '\0')) &&
         (b != (nk_command_buffer *)0x0)) &&
        ((((b->use_clipping == 0 ||
           (((pnVar1 = &b->clip, pnVar1->x <= x0 && (x0 < pnVar1->x + (b->clip).w)) &&
            (((b->clip).y <= y0 && (y0 < (b->clip).y + (b->clip).h)))))) ||
          ((((pnVar1->x <= x1 && (x1 < pnVar1->x + (b->clip).w)) && ((b->clip).y <= y1)) &&
           (y1 < (b->clip).y + (b->clip).h)))) ||
         ((((pnVar1->x <= x2 && (x2 < pnVar1->x + (b->clip).w)) && ((b->clip).y <= y2)) &&
          (y2 < (b->clip).y + (b->clip).h)))))) &&
       (pvVar2 = nk_command_buffer_push(b,NK_COMMAND_TRIANGLE_FILLED,0x20), pvVar2 != (void *)0x0))
    {
      *(short *)((long)pvVar2 + 0x10) = (short)(int)x0;
      *(short *)((long)pvVar2 + 0x12) = (short)(int)y0;
      *(short *)((long)pvVar2 + 0x14) = (short)(int)x1;
      *(short *)((long)pvVar2 + 0x16) = (short)(int)y1;
      *(short *)((long)pvVar2 + 0x18) = (short)(int)x2;
      *(short *)((long)pvVar2 + 0x1a) = (short)(int)y2;
      *(nk_color *)((long)pvVar2 + 0x1c) = c;
    }
    return;
  }
  __assert_fail("b",
                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                ,0x22f6,
                "void nk_fill_triangle(struct nk_command_buffer *, float, float, float, float, float, float, struct nk_color)"
               );
}

Assistant:

NK_API void
nk_fill_triangle(struct nk_command_buffer *b, float x0, float y0, float x1,
    float y1, float x2, float y2, struct nk_color c)
{
    struct nk_command_triangle_filled *cmd;
    NK_ASSERT(b);
    if (!b || c.a == 0) return;
    if (!b) return;
    if (b->use_clipping) {
        const struct nk_rect *clip = &b->clip;
        if (!NK_INBOX(x0, y0, clip->x, clip->y, clip->w, clip->h) &&
            !NK_INBOX(x1, y1, clip->x, clip->y, clip->w, clip->h) &&
            !NK_INBOX(x2, y2, clip->x, clip->y, clip->w, clip->h))
            return;
    }

    cmd = (struct nk_command_triangle_filled*)
        nk_command_buffer_push(b, NK_COMMAND_TRIANGLE_FILLED, sizeof(*cmd));
    if (!cmd) return;
    cmd->a.x = (short)x0;
    cmd->a.y = (short)y0;
    cmd->b.x = (short)x1;
    cmd->b.y = (short)y1;
    cmd->c.x = (short)x2;
    cmd->c.y = (short)y2;
    cmd->color = c;
}